

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O0

void bloaty::macho::ParseMachOHeader<bloaty::macho::ParseLoadCommands(bloaty::RangeSink*)::__0>
               (string_view macho_file,RangeSink *overhead_sink,
               anon_class_8_1_89918b91 *loadcmd_func)

{
  string_view data;
  uint32_t uVar1;
  uint32_t magic;
  undefined1 in_stack_ffffffffffffff98 [12];
  undefined4 in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffa8;
  int line;
  char *in_stack_ffffffffffffffb0;
  
  line = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  data._M_str._4_4_ = in_stack_ffffffffffffffa4;
  data._0_12_ = in_stack_ffffffffffffff98;
  uVar1 = ReadMagic(data);
  if ((uVar1 != 0xcefaedfe) && (uVar1 != 0xcffaedfe)) {
    if (uVar1 == 0xfeedface) {
      ParseMachOHeaderImpl<mach_header,bloaty::macho::ParseLoadCommands(bloaty::RangeSink*)::__0>
                (macho_file,overhead_sink,loadcmd_func);
    }
    else {
      if (uVar1 != 0xfeedfacf) {
        Throw(in_stack_ffffffffffffffb0,line);
      }
      ParseMachOHeaderImpl<mach_header_64,bloaty::macho::ParseLoadCommands(bloaty::RangeSink*)::__0>
                (macho_file,overhead_sink,loadcmd_func);
    }
    return;
  }
  Throw(in_stack_ffffffffffffffb0,line);
}

Assistant:

void ParseMachOHeader(string_view macho_file, RangeSink* overhead_sink,
                      Func&& loadcmd_func) {
  uint32_t magic = ReadMagic(macho_file);
  switch (magic) {
    case MH_MAGIC:
      // We don't expect to see many 32-bit binaries out in the wild.
      // Apple is aggressively phasing out support for 32-bit binaries:
      //   https://www.macrumors.com/2017/06/06/apple-to-phase-out-32-bit-mac-apps/
      //
      // Still, you can build 32-bit binaries as of this writing, and
      // there are existing 32-bit binaries floating around, so we might
      // as well support them.
      ParseMachOHeaderImpl<mach_header>(macho_file, overhead_sink,
                                        std::forward<Func>(loadcmd_func));
      break;
    case MH_MAGIC_64:
      ParseMachOHeaderImpl<mach_header_64>(
          macho_file, overhead_sink, std::forward<Func>(loadcmd_func));
      break;
    case MH_CIGAM:
    case MH_CIGAM_64:
      // OS X and Darwin currently only run on x86/x86-64 (little-endian
      // platforms), so we expect basically all Mach-O files to be
      // little-endian.  Additionally, pretty much all CPU architectures
      // are little-endian these days.  ARM has the option to be
      // big-endian, but I can't find any OS that is actually compiled to
      // use big-endian mode.  debian-mips is the only big-endian OS I can
      // find (and maybe SPARC).
      //
      // All of this is to say, this case should only happen if you are
      // running Bloaty on debian-mips.  I consider that uncommon enough
      // (and hard enough to test) that we don't support this until there
      // is a demonstrated need.
      THROW("We don't support cross-endian Mach-O files.");
    default:
      THROW("Corrupt Mach-O file");
  }
}